

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginal.cc
# Opt level: O1

void MARGINAL::predict_or_learn<true>(data *sm,single_learner *base,example *ec)

{
  float fVar1;
  byte bVar2;
  long lVar3;
  features *pfVar4;
  undefined8 *puVar5;
  features *pfVar6;
  features *pfVar7;
  byte *pbVar8;
  byte bVar9;
  undefined8 local_88 [12];
  float local_28;
  
  bVar9 = 0;
  make_marginal<true>(sm,ec);
  if (sm->update_before_learn == true) {
    (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
    fVar1 = (ec->pred).scalar;
    if (sm->compete == true) {
      sm->feature_pred = fVar1;
      compute_expert_loss<true>(sm,ec);
    }
    pbVar8 = (ec->super_example_predict).indices._begin;
    if (pbVar8 != (ec->super_example_predict).indices._end) {
      do {
        bVar2 = *pbVar8;
        if (sm->id_features[bVar2] == true) {
          pfVar7 = (ec->super_example_predict).feature_space + bVar2;
          pfVar4 = sm->temp + bVar2;
          puVar5 = local_88;
          for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
            *puVar5 = (pfVar4->values)._begin;
            pfVar4 = (features *)((long)pfVar4 + (ulong)bVar9 * -0x10 + 8);
            puVar5 = puVar5 + (ulong)bVar9 * -2 + 1;
          }
          pfVar4 = pfVar7;
          pfVar6 = sm->temp + bVar2;
          for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
            (pfVar6->values)._begin = (pfVar4->values)._begin;
            pfVar4 = (features *)((long)pfVar4 + ((ulong)bVar9 * -2 + 1) * 8);
            pfVar6 = (features *)((long)pfVar6 + (ulong)bVar9 * -0x10 + 8);
          }
          sm->temp[bVar2].sum_feat_sq = (ec->super_example_predict).feature_space[bVar2].sum_feat_sq
          ;
          puVar5 = local_88;
          for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
            (pfVar7->values)._begin = (float *)*puVar5;
            puVar5 = puVar5 + (ulong)bVar9 * -2 + 1;
            pfVar7 = (features *)((long)pfVar7 + ((ulong)bVar9 * -2 + 1) * 8);
          }
          (ec->super_example_predict).feature_space[bVar2].sum_feat_sq = local_28;
        }
        pbVar8 = pbVar8 + 1;
      } while (pbVar8 != (ec->super_example_predict).indices._end);
    }
    update_marginal(sm,ec);
    make_marginal<true>(sm,ec);
    (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
    (ec->pred).scalar = fVar1;
  }
  else {
    (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
    if (sm->compete == true) {
      sm->feature_pred = (ec->pred).scalar;
      compute_expert_loss<true>(sm,ec);
    }
    update_marginal(sm,ec);
  }
  pbVar8 = (ec->super_example_predict).indices._begin;
  if (pbVar8 != (ec->super_example_predict).indices._end) {
    do {
      bVar2 = *pbVar8;
      if (sm->id_features[bVar2] == true) {
        pfVar7 = (ec->super_example_predict).feature_space + bVar2;
        pfVar4 = sm->temp + bVar2;
        puVar5 = local_88;
        for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
          *puVar5 = (pfVar4->values)._begin;
          pfVar4 = (features *)((long)pfVar4 + (ulong)bVar9 * -0x10 + 8);
          puVar5 = puVar5 + (ulong)bVar9 * -2 + 1;
        }
        pfVar4 = pfVar7;
        pfVar6 = sm->temp + bVar2;
        for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
          (pfVar6->values)._begin = (pfVar4->values)._begin;
          pfVar4 = (features *)((long)pfVar4 + ((ulong)bVar9 * -2 + 1) * 8);
          pfVar6 = (features *)((long)pfVar6 + (ulong)bVar9 * -0x10 + 8);
        }
        sm->temp[bVar2].sum_feat_sq = (ec->super_example_predict).feature_space[bVar2].sum_feat_sq;
        puVar5 = local_88;
        for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
          (pfVar7->values)._begin = (float *)*puVar5;
          puVar5 = puVar5 + (ulong)bVar9 * -2 + 1;
          pfVar7 = (features *)((long)pfVar7 + ((ulong)bVar9 * -2 + 1) * 8);
        }
        (ec->super_example_predict).feature_space[bVar2].sum_feat_sq = local_28;
      }
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != (ec->super_example_predict).indices._end);
  }
  return;
}

Assistant:

void predict_or_learn(data& sm, LEARNER::single_learner& base, example& ec)
{
  make_marginal<is_learn>(sm, ec);
  if (is_learn)
    if (sm.update_before_learn)
    {
      base.predict(ec);
      float pred = ec.pred.scalar;
      if (sm.compete)
      {
        sm.feature_pred = pred;
        compute_expert_loss<is_learn>(sm, ec);
      }
      undo_marginal(sm, ec);
      update_marginal(sm, ec);  // update features before learning.
      make_marginal<is_learn>(sm, ec);
      base.learn(ec);
      ec.pred.scalar = pred;
    }
    else
    {
      base.learn(ec);
      if (sm.compete)
      {
        sm.feature_pred = ec.pred.scalar;
        compute_expert_loss<is_learn>(sm, ec);
      }
      update_marginal(sm, ec);
    }
  else
  {
    base.predict(ec);
    float pred = ec.pred.scalar;
    if (sm.compete)
    {
      sm.feature_pred = pred;
      compute_expert_loss<is_learn>(sm, ec);
    }
  }

  // undo marginalization
  undo_marginal(sm, ec);
}